

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
           *this,timer_holder *timer,duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  reference_counter_type *prVar1;
  _Manager_type p_Var2;
  timer_object_holder<timertt::thread_safety::unsafe> local_30;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_30.m_timer = timer->m_timer;
  timer->m_timer = (timer_object<timertt::thread_safety::unsafe> *)0x0;
  local_18 = (_Manager_type)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = action->_M_invoker;
  p_Var2 = (action->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)&(action->super__Function_base)._M_functor
    ;
    local_28._8_8_ = *(undefined8 *)((long)&(action->super__Function_base)._M_functor + 8);
    (action->super__Function_base)._M_manager = (_Manager_type)0x0;
    action->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var2;
  }
  timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
              *)this,&local_30,pause,period,(timer_action *)&local_28);
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  if (local_30.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
    prVar1 = &(local_30.m_timer)->m_references;
    *prVar1 = *prVar1 - 1;
    if (*prVar1 == 0) {
      (*(local_30.m_timer)->_vptr_timer_object[1])();
    }
  }
  return;
}

Assistant:

inline timer_object_holder( timer_object_holder && o )
		:	m_timer( o.m_timer )
	{
		o.m_timer = nullptr;
	}